

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_public.c
# Opt level: O2

void nhr_request_add_data_parameter
               (nhr_request request,char *name,char *file_name,void *data,size_t data_size)

{
  size_t len;
  size_t len_00;
  void *__dest;
  _nhr_map_node *p_Var1;
  char *pcVar2;
  
  if (data_size != 0 && (data != (void *)0x0 && request != (nhr_request)0x0)) {
    if (name == (char *)0x0) {
      len = 0;
    }
    else {
      len = strlen(name);
    }
    if (file_name != (char *)0x0) {
      len_00 = strlen(file_name);
      if (len_00 != 0 && len != 0) {
        if (request->method == 0) {
          __assert_fail("request->method",
                        "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/src/nhr_request_public.c"
                        ,0xb3,
                        "void nhr_request_add_data_parameter(nhr_request, const char *, const char *, const void *, const size_t)"
                       );
        }
        __dest = nhr_malloc(data_size);
        if (__dest != (void *)0x0) {
          memcpy(__dest,data,data_size);
          p_Var1 = request->parameters;
          if (p_Var1 == (_nhr_map_node *)0x0) {
            p_Var1 = nhr_map_create();
            request->parameters = p_Var1;
          }
          p_Var1 = nhr_map_append(p_Var1);
          pcVar2 = nhr_string_copy_len(name,len);
          p_Var1->key = pcVar2;
          pcVar2 = nhr_string_copy_len(file_name,len_00);
          (p_Var1->reserved).string = pcVar2;
          p_Var1->reserved_size = len_00;
          p_Var1->reserved_type = '\x02';
          p_Var1->value_type = '\x01';
          (p_Var1->value).data = __dest;
          p_Var1->value_size = data_size;
          request->is_have_data_parameter = '\x01';
          if (request->boundary == (char *)0x0) {
            nhr_request_generate_new_boundary(request);
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void nhr_request_add_data_parameter(nhr_request request, const char * name, const char * file_name, const void * data, const size_t data_size) {
#if !defined(NHR_NO_POST) // POST functionality
#if !defined(NHR_NO_POST_DATA) // POST DATA functionality
    size_t name_len = 0, file_name_len = 0;
    _nhr_map_node * last = NULL;
    if (!request || !data || data_size == 0) {
        return;
    }
    
    name_len = name ? strlen(name) : 0;
    file_name_len = file_name ? strlen(file_name) : 0;
    if (name_len == 0 || file_name_len == 0) {
        return;
    }
    
    assert(request->method); //!!! set method
    
    void * _data = nhr_malloc(data_size);
    if (!_data) {
        return;
    }
    
    memcpy(_data, data, data_size);
    
    if (!request->parameters) {
        request->parameters = nhr_map_create();
    }
    
    last = nhr_map_append(request->parameters);
    last->key = nhr_string_copy_len(name, name_len);
    last->reserved.string = nhr_string_copy_len(file_name, file_name_len);
    last->reserved_size = file_name_len;
    last->reserved_type = NHR_MAP_VALUE_STRING;
    last->value.data = _data;
    last->value_size = data_size;
    last->value_type = NHR_MAP_VALUE_DATA;

	request->is_have_data_parameter = nhr_true;
    if (!request->boundary) {
        nhr_request_generate_new_boundary(request);
    }
#endif // end POST functionality
#endif // end POST DATA functionality
}